

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void Assimp::FBX::ParseVectorDataArray
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *out,Element *el)

{
  bool bVar1;
  const_reference ppTVar2;
  Element *pEVar3;
  TokenList *pTVar4;
  reference ppTVar5;
  value_type_conflict4 local_170;
  allocator local_169;
  string local_168;
  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
  local_148;
  value_type_conflict4 local_13c;
  const_iterator cStack_138;
  int ival;
  const_iterator end_1;
  const_iterator it;
  string local_120;
  Element *local_100;
  Element *a;
  Scope *scope;
  size_t dim;
  string local_e0;
  int local_c0;
  uint local_bc;
  int32_t val;
  uint i;
  int32_t *ip;
  vector<char,_std::allocator<char>_> buff;
  string local_90;
  uint32_t local_70;
  char local_69;
  uint32_t count;
  char type;
  char *end;
  char *data;
  allocator local_41;
  string local_40;
  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *local_20;
  TokenList *tok;
  Element *el_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  
  tok = (TokenList *)el;
  el_local = (Element *)out;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(out,0);
  local_20 = Element::Tokens((Element *)tok);
  bVar1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
          empty(local_20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"unexpected empty element",&local_41);
    anon_unknown.dwarf_bcfbe9::ParseError(&local_40,(Element *)tok);
  }
  ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            operator[](local_20,0);
  bVar1 = Token::IsBinary(*ppTVar2);
  if (bVar1) {
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_20,0);
    end = Token::begin(*ppTVar2);
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_20,0);
    _count = Token::end(*ppTVar2);
    anon_unknown_16::ReadBinaryDataArrayHead(&end,_count,&local_69,&local_70,(Element *)tok);
    if (local_70 != 0) {
      if (local_69 != 'i') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_90,"expected (u)int array (binary)",
                   (allocator *)
                   &buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
        anon_unknown.dwarf_bcfbe9::ParseError(&local_90,(Element *)tok);
      }
      std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&ip);
      anon_unknown_16::ReadBinaryDataArray
                (local_69,local_70,&end,_count,(vector<char,_std::allocator<char>_> *)&ip,
                 (Element *)tok);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)el_local,(ulong)local_70);
      _val = (int *)std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)&ip,0);
      for (local_bc = 0; local_bc < local_70; local_bc = local_bc + 1) {
        local_c0 = *_val;
        if (local_c0 < 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_e0,"encountered negative integer index (binary)",
                     (allocator *)((long)&dim + 7));
          anon_unknown.dwarf_bcfbe9::ParseError(&local_e0,(Element *)0x0);
        }
        dim._0_4_ = local_c0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)el_local,
                   (value_type_conflict4 *)&dim);
        _val = _val + 1;
      }
      std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&ip);
    }
  }
  else {
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_20,0);
    scope = (Scope *)ParseTokenAsDim(*ppTVar2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)el_local,(size_type)scope);
    pEVar3 = (Element *)GetRequiredScope((Element *)tok);
    a = pEVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"a",(allocator *)((long)&it._M_current + 7));
    pEVar3 = GetRequiredElement((Scope *)pEVar3,&local_120,(Element *)tok);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    local_100 = pEVar3;
    pTVar4 = Element::Tokens(pEVar3);
    end_1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            begin(pTVar4);
    pTVar4 = Element::Tokens(local_100);
    cStack_138 = std::
                 vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
                 end(pTVar4);
    while (bVar1 = __gnu_cxx::operator!=(&end_1,&stack0xfffffffffffffec8), bVar1) {
      local_148 = __gnu_cxx::
                  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                  ::operator++(&end_1,0);
      ppTVar5 = __gnu_cxx::
                __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                ::operator*(&local_148);
      local_13c = ParseTokenAsInt(*ppTVar5);
      if ((int)local_13c < 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_168,"encountered negative integer index",&local_169);
        anon_unknown.dwarf_bcfbe9::ParseError(&local_168,(Element *)0x0);
      }
      local_170 = local_13c;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)el_local,&local_170);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<unsigned int>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(!count) {
            return;
        }

        if (type != 'i') {
            ParseError("expected (u)int array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * 4);

        out.reserve(count);

        const int32_t* ip = reinterpret_cast<const int32_t*>(&buff[0]);
        for (unsigned int i = 0; i < count; ++i, ++ip) {
            BE_NCONST int32_t val = *ip;
            if(val < 0) {
                ParseError("encountered negative integer index (binary)");
            }

            AI_SWAP4(val);
            out.push_back(val);
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray()
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        const int ival = ParseTokenAsInt(**it++);
        if(ival < 0) {
            ParseError("encountered negative integer index");
        }
        out.push_back(static_cast<unsigned int>(ival));
    }
}